

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

void sock_destroy(nni_sock *s)

{
  nni_stat_unregister(&s->st_root);
  if (s->s_data != (void *)0x0) {
    (*(s->s_sock_ops).sock_fini)(s->s_data);
  }
  nni_msgq_fini(s->s_urq);
  nni_msgq_fini(s->s_uwq);
  nni_cv_fini(&s->s_close_cv);
  nni_cv_fini(&s->s_cv);
  nni_mtx_fini(&s->s_mx);
  nni_mtx_fini(&s->s_pipe_cbs_mtx);
  nni_free(s,s->s_size);
  return;
}

Assistant:

static void
sock_destroy(nni_sock *s)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_unregister(&s->st_root);
#endif

	// The protocol needs to clean up its state.
	if (s->s_data != NULL) {
		s->s_sock_ops.sock_fini(s->s_data);
	}

	nni_msgq_fini(s->s_urq);
	nni_msgq_fini(s->s_uwq);
	nni_cv_fini(&s->s_close_cv);
	nni_cv_fini(&s->s_cv);
	nni_mtx_fini(&s->s_mx);
	nni_mtx_fini(&s->s_pipe_cbs_mtx);
	nni_free(s, s->s_size);
}